

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileInfo.cpp
# Opt level: O0

FileChecksum *
llbuild::basic::FileChecksum::getChecksumForPath(FileChecksum *__return_storage_ptr__,string *path)

{
  bool bVar1;
  EVP_PKEY_CTX *src;
  undefined1 local_120 [8];
  PlatformSpecificHasher hasher;
  FileInfo fileInfo;
  string *path_local;
  
  FileChecksum(__return_storage_ptr__);
  FileInfo::getInfoForPath((FileInfo *)(hasher.output.Bytes._M_elems + 8),path,false);
  bVar1 = FileInfo::isMissing((FileInfo *)(hasher.output.Bytes._M_elems + 8));
  if (bVar1) {
    memset(__return_storage_ptr__,0,0x20);
  }
  else {
    bVar1 = FileInfo::isDirectory((FileInfo *)(hasher.output.Bytes._M_elems + 8));
    if (bVar1) {
      __return_storage_ptr__->bytes[0] = '\x01';
    }
    else {
      FileChecksumHasherMD5::FileChecksumHasherMD5((FileChecksumHasherMD5 *)local_120,path);
      bVar1 = FileChecksumHasher::readAndDigest((FileChecksumHasher *)local_120);
      if (bVar1) {
        FileChecksumHasherMD5::copy
                  ((FileChecksumHasherMD5 *)local_120,(EVP_PKEY_CTX *)__return_storage_ptr__,src);
      }
      else {
        memset(__return_storage_ptr__,0,0x20);
      }
      FileChecksumHasherMD5::~FileChecksumHasherMD5((FileChecksumHasherMD5 *)local_120);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

FileChecksum FileChecksum::getChecksumForPath(const std::string& path) {
  FileChecksum result;

  FileInfo fileInfo = FileInfo::getInfoForPath(path);
  if (fileInfo.isMissing()) {
    memset(result.bytes, 0, sizeof(result.bytes));
  } else if (fileInfo.isDirectory()) {
    result.bytes[0] = 1;
  } else {
    PlatformSpecificHasher hasher(path);
    if (hasher.readAndDigest()) {
      hasher.copy(result.bytes);
    } else {
      memset(result.bytes, 0, sizeof(result.bytes));
    }
  }

  return result;
}